

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  OfType OVar2;
  TestCaseInfo *this_00;
  AssertionStats *this_01;
  AssertionStats *in_RSI;
  Option<Catch::AssertionResult> *in_RDI;
  AssertionResult *in_stack_fffffffffffffee0;
  AssertionResult *_value;
  RunContext *in_stack_ffffffffffffff00;
  AssertionResult local_f8;
  Totals *in_stack_ffffffffffffffd8;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffffe0;
  AssertionResult *in_stack_ffffffffffffffe8;
  
  OVar2 = AssertionResult::getResultType((AssertionResult *)in_RSI);
  if (OVar2 == Ok) {
    *(long *)(in_RDI[1].storage + 0x58) = *(long *)(in_RDI[1].storage + 0x58) + 1;
    in_RDI[3].storage[0x19] = '\x01';
  }
  else {
    bVar1 = AssertionResult::isOk(in_stack_fffffffffffffee0);
    if (bVar1) {
      in_RDI[3].storage[0x19] = '\x01';
    }
    else {
      in_RDI[3].storage[0x19] = '\0';
      this_00 = TestCase::getTestCaseInfo(*(TestCase **)(in_RDI->storage + 0x30));
      bVar1 = TestCaseInfo::okToFail(this_00);
      if (bVar1) {
        *(long *)(in_RDI[1].storage + 0x68) = *(long *)(in_RDI[1].storage + 0x68) + 1;
      }
      else {
        *(long *)(in_RDI[1].storage + 0x60) = *(long *)(in_RDI[1].storage + 0x60) + 1;
      }
    }
  }
  this_01 = (AssertionStats *)
            clara::std::
            unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
            operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)0x13358b);
  _value = &local_f8;
  AssertionStats::AssertionStats
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  (*this_01->_vptr_AssertionStats[10])(this_01,_value);
  AssertionStats::~AssertionStats(this_01);
  OVar2 = AssertionResult::getResultType((AssertionResult *)in_RSI);
  if (OVar2 != Warning) {
    clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
              ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x1335ff);
  }
  resetAssertionInfo(in_stack_ffffffffffffff00);
  Option<Catch::AssertionResult>::operator=(in_RDI,_value);
  return;
}

Assistant:

void RunContext::assertionEnded(AssertionResult const & result) {
        if (result.getResultType() == ResultWas::Ok) {
            m_totals.assertions.passed++;
            m_lastAssertionPassed = true;
        } else if (!result.isOk()) {
            m_lastAssertionPassed = false;
            if( m_activeTestCase->getTestCaseInfo().okToFail() )
                m_totals.assertions.failedButOk++;
            else
                m_totals.assertions.failed++;
        }
        else {
            m_lastAssertionPassed = true;
        }

        // We have no use for the return value (whether messages should be cleared), because messages were made scoped
        // and should be let to clear themselves out.
        static_cast<void>(m_reporter->assertionEnded(AssertionStats(result, m_messages, m_totals)));

        if (result.getResultType() != ResultWas::Warning)
            m_messageScopes.clear();

        // Reset working state
        resetAssertionInfo();
        m_lastResult = result;
    }